

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_short,10u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  ushort uVar9;
  uint uVar10;
  uint recent;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  iVar8 = 0;
  uVar9 = 0;
  sVar3 = 0;
  bVar13 = false;
  uVar12 = 0;
  do {
    uVar4 = (uVar9 & 0x3ff) * 2;
    uVar5 = (ushort)uVar12 & 0x3ff;
    uVar11 = 0;
    uVar10 = uVar12;
    do {
      if (uVar11 < uVar12) {
        iVar7 = 7;
        if ((int)uVar10 < 0x200 - bias) {
LAB_001026aa:
          uVar1 = (ushort)uVar11;
          uVar6 = uVar1 & 0x400 | uVar5;
          uVar2 = uVar1 & 0x3ff;
          if (uVar2 < uVar5) {
            if ((ushort)(0x200 - bias) <= (ushort)(uVar5 - uVar2)) {
              uVar6 = uVar6 - 0x400;
            }
          }
          else if ((ushort)(bias + 0x200) < (ushort)(uVar2 - uVar5)) {
            uVar6 = uVar6 + 0x400;
          }
          iVar7 = 1;
          if ((uVar6 == (ushort)uVar12) &&
             ((bias != 0 ||
              ((ushort)(((uVar4 & 0x400) + sVar3) - ((ushort)uVar10 & 0x3ff)) == uVar1)))) {
            iVar7 = 0;
          }
        }
      }
      else {
        if ((int)(iVar8 + uVar11) <= bias + 0x200) goto LAB_001026aa;
        iVar7 = 7;
      }
      if ((iVar7 != 7) && (iVar7 != 0)) goto LAB_00102748;
      uVar11 = uVar11 + 1;
      uVar4 = uVar4 - 2;
      uVar10 = uVar10 - 1;
    } while (uVar11 != 0x800);
    iVar7 = 5;
LAB_00102748:
    if ((iVar7 != 5) && (iVar7 != 0)) {
      return bVar13;
    }
    bVar13 = 0x7fe < uVar12;
    uVar12 = uVar12 + 1;
    sVar3 = sVar3 + 1;
    uVar9 = uVar9 + 1;
    iVar8 = iVar8 + -1;
    if (uVar12 == 0x800) {
      return bVar13;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}